

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderDoExpand(xmlTextReaderPtr reader)

{
  int iVar1;
  xmlNodePtr pxVar2;
  int val;
  xmlTextReaderPtr reader_local;
  
  if (((reader == (xmlTextReaderPtr)0x0) || (reader->node == (xmlNodePtr)0x0)) ||
     (reader->ctxt == (xmlParserCtxtPtr)0x0)) {
    reader_local._4_4_ = -1;
  }
  else {
    do {
      if (reader->ctxt->instate == XML_PARSER_EOF) {
        return 1;
      }
      pxVar2 = xmlTextReaderGetSuccessor(reader->node);
      if (pxVar2 != (xmlNodePtr)0x0) {
        return 1;
      }
      if (reader->ctxt->nodeNr < reader->depth) {
        return 1;
      }
      if (reader->mode == 3) {
        return 1;
      }
      iVar1 = xmlTextReaderPushData(reader);
      if (iVar1 < 0) {
        reader->mode = 2;
        return -1;
      }
    } while (reader->mode != 3);
    reader_local._4_4_ = 1;
  }
  return reader_local._4_4_;
}

Assistant:

static int
xmlTextReaderDoExpand(xmlTextReaderPtr reader) {
    int val;

    if ((reader == NULL) || (reader->node == NULL) || (reader->ctxt == NULL))
        return(-1);
    do {
	if (reader->ctxt->instate == XML_PARSER_EOF) return(1);

        if (xmlTextReaderGetSuccessor(reader->node) != NULL)
	    return(1);
	if (reader->ctxt->nodeNr < reader->depth)
	    return(1);
	if (reader->mode == XML_TEXTREADER_MODE_EOF)
	    return(1);
	val = xmlTextReaderPushData(reader);
	if (val < 0){
	    reader->mode = XML_TEXTREADER_MODE_ERROR;
	    return(-1);
	}
    } while(reader->mode != XML_TEXTREADER_MODE_EOF);
    return(1);
}